

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void free_parser(vw *all)

{
  parser *ppVar1;
  substring *psVar2;
  unsigned_long *puVar3;
  io_buf *piVar4;
  char *pcVar5;
  _Map_pointer pppeVar6;
  example *peVar7;
  
  ppVar1 = all->p;
  psVar2 = (ppVar1->words)._begin;
  if (psVar2 != (substring *)0x0) {
    free(psVar2);
  }
  (ppVar1->words)._begin = (substring *)0x0;
  (ppVar1->words)._end = (substring *)0x0;
  (ppVar1->words).end_array = (substring *)0x0;
  ppVar1 = all->p;
  psVar2 = (ppVar1->name)._begin;
  if (psVar2 != (substring *)0x0) {
    free(psVar2);
  }
  (ppVar1->name)._begin = (substring *)0x0;
  (ppVar1->name)._end = (substring *)0x0;
  (ppVar1->name).end_array = (substring *)0x0;
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVar1 = all->p;
    puVar3 = (ppVar1->gram_mask)._begin;
    if (puVar3 != (unsigned_long *)0x0) {
      free(puVar3);
    }
    (ppVar1->gram_mask)._begin = (unsigned_long *)0x0;
    (ppVar1->gram_mask)._end = (unsigned_long *)0x0;
    (ppVar1->gram_mask).end_array = (unsigned_long *)0x0;
  }
  piVar4 = all->p->output;
  if (piVar4 != (io_buf *)0x0) {
    pcVar5 = (piVar4->finalname)._begin;
    if (pcVar5 != (char *)0x0) {
      free(pcVar5);
    }
    (piVar4->finalname)._begin = (char *)0x0;
    (piVar4->finalname)._end = (char *)0x0;
    (piVar4->finalname).end_array = (char *)0x0;
    pcVar5 = (piVar4->currentname)._begin;
    if (pcVar5 != (char *)0x0) {
      free(pcVar5);
    }
    (piVar4->currentname)._begin = (char *)0x0;
    (piVar4->currentname)._end = (char *)0x0;
    (piVar4->currentname).end_array = (char *)0x0;
  }
  while (ppVar1 = all->p,
        (ppVar1->example_pool).m_pool.c.super__Deque_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (ppVar1->example_pool).m_pool.c.super__Deque_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
    peVar7 = VW::object_pool<example,_example_initializer>::get_object(&ppVar1->example_pool);
    VW::dealloc_example((all->p->lp).delete_label,peVar7,all->delete_prediction);
  }
  while (ppVar1 = all->p,
        pppeVar6 = *(_Map_pointer *)
                    ((long)&(ppVar1->ready_parsed_examples).object_queue.c.
                            super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                            super__Deque_impl_data._M_finish + 0x18),
        ((long)*(_Elt_pointer *)
                ((long)&(ppVar1->ready_parsed_examples).object_queue.c.
                        super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Deque_impl_data._M_start + 0x10) -
         (long)(ppVar1->ready_parsed_examples).object_queue.c.
               super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)(ppVar1->ready_parsed_examples).object_queue.c.
               super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)*(_Elt_pointer *)
                ((long)&(ppVar1->ready_parsed_examples).object_queue.c.
                        super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Deque_impl_data._M_finish + 8) >> 3) +
        ((((ulong)((long)pppeVar6 -
                  (long)*(_Map_pointer *)
                         ((long)&(ppVar1->ready_parsed_examples).object_queue.c.
                                 super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                                 super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
        (ulong)(pppeVar6 == (_Map_pointer)0x0)) * 0x40 != 0) {
    peVar7 = VW::ptr_queue<example>::pop(&ppVar1->ready_parsed_examples);
    VW::dealloc_example((all->p->lp).delete_label,peVar7,all->delete_prediction);
  }
  puVar3 = (ppVar1->counts)._begin;
  if (puVar3 != (unsigned_long *)0x0) {
    free(puVar3);
  }
  (ppVar1->counts)._begin = (unsigned_long *)0x0;
  (ppVar1->counts)._end = (unsigned_long *)0x0;
  (ppVar1->counts).end_array = (unsigned_long *)0x0;
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  while (! all.p->example_pool.empty())
    {
      example* temp = all.p->example_pool.get_object();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }

  while (all.p->ready_parsed_examples.size() != 0)
    {
      example* temp = all.p->ready_parsed_examples.pop();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }
  all.p->counts.delete_v();
}